

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

bool __thiscall TokenScanner::hasMoreTokens(TokenScanner *this)

{
  bool bVar1;
  string local_50 [32];
  string token;
  TokenScanner *this_local;
  
  nextToken_abi_cxx11_((TokenScanner *)&stack0xffffffffffffffd0);
  std::__cxx11::string::string(local_50,(string *)&stack0xffffffffffffffd0);
  saveToken(this,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xffffffffffffffd0,"");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return bVar1;
}

Assistant:

bool TokenScanner::hasMoreTokens() {
   string token = nextToken();
   saveToken(token);
   return (token != "");
}